

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutTruth.c
# Opt level: O0

void Cut_TruthCompute(Cut_Man_t *p,Cut_Cut_t *pCut,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,int fCompl0,
                     int fCompl1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  uint *puVar6;
  int fCompl1_local;
  int fCompl0_local;
  Cut_Cut_t *pCut1_local;
  Cut_Cut_t *pCut0_local;
  Cut_Cut_t *pCut_local;
  Cut_Man_t *p_local;
  
  if (fCompl0 == 0) {
    puVar6 = p->puTemp[0];
    puVar5 = Cut_CutReadTruth(pCut0);
    Extra_TruthCopy(puVar6,puVar5,*(uint *)pCut >> 0x18 & 0xf);
  }
  else {
    puVar6 = p->puTemp[0];
    puVar5 = Cut_CutReadTruth(pCut0);
    Extra_TruthNot(puVar6,puVar5,*(uint *)pCut >> 0x18 & 0xf);
  }
  puVar6 = p->puTemp[2];
  puVar5 = p->puTemp[0];
  uVar1 = *(uint *)pCut0;
  uVar2 = *(uint *)pCut;
  uVar3 = Cut_TruthPhase(pCut,pCut0);
  Extra_TruthStretch(puVar6,puVar5,uVar1 >> 0x1c,uVar2 >> 0x18 & 0xf,uVar3);
  if (fCompl1 == 0) {
    puVar6 = p->puTemp[1];
    puVar5 = Cut_CutReadTruth(pCut1);
    Extra_TruthCopy(puVar6,puVar5,*(uint *)pCut >> 0x18 & 0xf);
  }
  else {
    puVar6 = p->puTemp[1];
    puVar5 = Cut_CutReadTruth(pCut1);
    Extra_TruthNot(puVar6,puVar5,*(uint *)pCut >> 0x18 & 0xf);
  }
  puVar6 = p->puTemp[3];
  puVar5 = p->puTemp[1];
  uVar1 = *(uint *)pCut1;
  uVar2 = *(uint *)pCut;
  uVar3 = Cut_TruthPhase(pCut,pCut1);
  Extra_TruthStretch(puVar6,puVar5,uVar1 >> 0x1c,uVar2 >> 0x18 & 0xf,uVar3);
  if ((*(uint *)pCut >> 0x17 & 1) == 0) {
    puVar6 = Cut_CutReadTruth(pCut);
    Extra_TruthAnd(puVar6,p->puTemp[2],p->puTemp[3],*(uint *)pCut >> 0x18 & 0xf);
  }
  else {
    puVar6 = Cut_CutReadTruth(pCut);
    Extra_TruthNand(puVar6,p->puTemp[2],p->puTemp[3],*(uint *)pCut >> 0x18 & 0xf);
  }
  if ((p->pParams->fFancy != 0) && (*(uint *)pCut >> 0x1c == 7)) {
    nTotal = nTotal + 1;
    puVar6 = Cut_CutReadTruth(pCut);
    iVar4 = Extra_TruthMinCofSuppOverlap(puVar6,*(uint *)pCut >> 0x18 & 0xf,(int *)0x0);
    if (iVar4 < 5) {
      nGood = nGood + 1;
    }
  }
  return;
}

Assistant:

void Cut_TruthCompute( Cut_Man_t * p, Cut_Cut_t * pCut, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    // permute the first table
    if ( fCompl0 ) 
        Extra_TruthNot( p->puTemp[0], Cut_CutReadTruth(pCut0), pCut->nVarsMax );
    else
        Extra_TruthCopy( p->puTemp[0], Cut_CutReadTruth(pCut0), pCut->nVarsMax );
    Extra_TruthStretch( p->puTemp[2], p->puTemp[0], pCut0->nLeaves, pCut->nVarsMax, Cut_TruthPhase(pCut, pCut0) );
    // permute the second table
    if ( fCompl1 ) 
        Extra_TruthNot( p->puTemp[1], Cut_CutReadTruth(pCut1), pCut->nVarsMax );
    else
        Extra_TruthCopy( p->puTemp[1], Cut_CutReadTruth(pCut1), pCut->nVarsMax );
    Extra_TruthStretch( p->puTemp[3], p->puTemp[1], pCut1->nLeaves, pCut->nVarsMax, Cut_TruthPhase(pCut, pCut1) );
    // produce the resulting table
    if ( pCut->fCompl )
        Extra_TruthNand( Cut_CutReadTruth(pCut), p->puTemp[2], p->puTemp[3], pCut->nVarsMax );
    else
        Extra_TruthAnd( Cut_CutReadTruth(pCut), p->puTemp[2], p->puTemp[3], pCut->nVarsMax );

//    Ivy_TruthTestOne( *Cut_CutReadTruth(pCut) );

    // quit if no fancy computation is needed
    if ( !p->pParams->fFancy )
        return;

    if ( pCut->nLeaves != 7 )
        return;

    // count the total number of truth tables computed
    nTotal++;

    // MAPPING INTO ALTERA 6-2 LOGIC BLOCKS
    // call this procedure to find the minimum number of common variables in the cofactors
    // if this number is less or equal than 3, the cut can be implemented using the 6-2 logic block
    if ( Extra_TruthMinCofSuppOverlap( Cut_CutReadTruth(pCut), pCut->nVarsMax, NULL ) <= 4 )
        nGood++;

    // MAPPING INTO ACTEL 2x2 CELLS
    // call this procedure to see if a semi-canonical form can be found in the lookup table 
    // (if it exists, then a two-level 3-input LUT implementation of the cut exists)
    // Before this procedure is called, cell manager should be defined by calling
    // Cut_CellLoad (make sure file "cells22_daomap_iwls.txt" is available in the working dir)
//    if ( Cut_CellIsRunning() && pCut->nVarsMax <= 9 )
//        nGood += Cut_CellTruthLookup( Cut_CutReadTruth(pCut), pCut->nVarsMax );
}